

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject * luaC_newobj(lua_State *L,lu_byte tt,size_t sz)

{
  GCObject *pGVar1;
  
  pGVar1 = luaC_newobjdt(L,tt,sz,0);
  return pGVar1;
}

Assistant:

GCObject *luaC_newobj (lua_State *L, lu_byte tt, size_t sz) {
  return luaC_newobjdt(L, tt, sz, 0);
}